

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementScroll.cpp
# Opt level: O1

void __thiscall Rml::ElementScroll::FormatScrollbars(ElementScroll *this)

{
  WidgetScroll *pWVar1;
  Element *pEVar2;
  Vector2f _content;
  Vector2f offset_00;
  Vector2f VVar3;
  Box *this_00;
  ComputedValues *pCVar4;
  Box *pBVar5;
  BoxEdge edge;
  Scrollbar *pSVar6;
  long lVar7;
  int i;
  ulong uVar8;
  BoxEdge edge_00;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  Vector2f containing_block;
  Box corner_box;
  Vector2f offset;
  Vector2f local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  Box local_b8;
  Property local_80;
  
  this_00 = Element::GetBox(this->element);
  local_e0 = Box::GetSize(this_00,Padding);
  local_d8._8_4_ = extraout_XMM0_Dc;
  local_d8._0_4_ = local_e0.x;
  local_d8._4_4_ = local_e0.y;
  local_d8._12_4_ = extraout_XMM0_Dd;
  lVar7 = 4;
  uVar8 = 0;
  pSVar6 = this->scrollbars;
  do {
    if (pSVar6->enabled == true) {
      pWVar1 = (pSVar6->widget)._M_t.
               super___uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>.
               _M_t.
               super__Tuple_impl<0UL,_Rml::WidgetScroll_*,_std::default_delete<Rml::WidgetScroll>_>.
               super__Head_base<0UL,_Rml::WidgetScroll_*,_false>._M_head_impl;
      if (uVar8 == 0) {
        fVar9 = Element::GetClientHeight(this->element);
        WidgetScroll::SetBarLength(pWVar1,fVar9);
        pWVar1 = (pSVar6->widget)._M_t.
                 super___uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Rml::WidgetScroll_*,_std::default_delete<Rml::WidgetScroll>_>
                 .super__Head_base<0UL,_Rml::WidgetScroll_*,_false>._M_head_impl;
        fVar9 = Element::GetScrollHeight(this->element);
        WidgetScroll::SetTrackLength(pWVar1,fVar9);
        fVar9 = Element::GetScrollHeight(this->element);
        fVar10 = Element::GetClientHeight(this->element);
        pWVar1 = (pSVar6->widget)._M_t.
                 super___uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Rml::WidgetScroll_*,_std::default_delete<Rml::WidgetScroll>_>
                 .super__Head_base<0UL,_Rml::WidgetScroll_*,_false>._M_head_impl;
        if (fVar9 - fVar10 <= 0.0) {
          fVar11 = 0.0;
        }
        else {
          fVar11 = Element::GetScrollTop(this->element);
          fVar11 = fVar11 / (fVar9 - fVar10);
        }
        WidgetScroll::SetBarPosition(pWVar1,fVar11);
        edge_00 = Right;
        edge = Top;
      }
      else {
        fVar9 = Element::GetClientWidth(this->element);
        WidgetScroll::SetBarLength(pWVar1,fVar9);
        pWVar1 = (pSVar6->widget)._M_t.
                 super___uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Rml::WidgetScroll_*,_std::default_delete<Rml::WidgetScroll>_>
                 .super__Head_base<0UL,_Rml::WidgetScroll_*,_false>._M_head_impl;
        fVar9 = Element::GetScrollWidth(this->element);
        WidgetScroll::SetTrackLength(pWVar1,fVar9);
        fVar9 = Element::GetScrollWidth(this->element);
        fVar10 = Element::GetClientWidth(this->element);
        pWVar1 = (pSVar6->widget)._M_t.
                 super___uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Rml::WidgetScroll_*,_std::default_delete<Rml::WidgetScroll>_>
                 .super__Head_base<0UL,_Rml::WidgetScroll_*,_false>._M_head_impl;
        if (fVar9 - fVar10 <= 0.0) {
          fVar11 = 0.0;
        }
        else {
          fVar11 = Element::GetScrollLeft(this->element);
          fVar11 = fVar11 / (fVar9 - fVar10);
        }
        WidgetScroll::SetBarPosition(pWVar1,fVar11);
        edge_00 = Bottom;
        edge = Left;
      }
      fVar9 = *(float *)(local_d8 + lVar7 + -8);
      pCVar4 = Element::GetComputedValues(pSVar6->element);
      fVar10 = (pCVar4->rare).scrollbar_margin;
      fVar11 = 0.0;
      if (this->scrollbars[uVar8 ^ 1].enabled == true) {
        fVar11 = this->scrollbars[uVar8 ^ 1].size;
      }
      if (fVar10 <= fVar11) {
        fVar10 = fVar11;
      }
      WidgetScroll::FormatElements
                ((pSVar6->widget)._M_t.
                 super___uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Rml::WidgetScroll_*,_std::default_delete<Rml::WidgetScroll>_>
                 .super__Head_base<0UL,_Rml::WidgetScroll_*,_false>._M_head_impl,
                 (Vector2f)local_d8._0_8_,fVar9 - fVar10);
      VVar3 = Box::GetPosition(this_00,Padding);
      local_80.value.type._0_4_ = VVar3.x;
      local_80.value.type._4_4_ = VVar3.y;
      fVar9 = *(float *)(local_d8 + uVar8 * 4 + -8);
      pBVar5 = Element::GetBox(pSVar6->element);
      local_b8.content = Box::GetSize(pBVar5,Border);
      local_c8._0_4_ = *(undefined4 *)((long)(local_b8.area_edges + -1) + 8 + uVar8 * 4);
      pBVar5 = Element::GetBox(pSVar6->element);
      fVar10 = Box::GetEdge(pBVar5,Margin,edge_00);
      *(float *)(local_80.value.data + uVar8 * 4 + -8) =
           (fVar9 - (fVar10 + (float)local_c8._0_4_)) +
           *(float *)(local_80.value.data + uVar8 * 4 + -8);
      pBVar5 = Element::GetBox(pSVar6->element);
      fVar9 = Box::GetEdge(pBVar5,Margin,edge);
      *(float *)(local_80.value.data + lVar7 + -8) =
           fVar9 + *(float *)(local_80.value.data + lVar7 + -8);
      Element::SetOffset(pSVar6->element,(Vector2f)local_80.value.type,this->element,true);
    }
    uVar8 = uVar8 + 1;
    pSVar6 = pSVar6 + 1;
    lVar7 = lVar7 + -4;
  } while (uVar8 == 1);
  if ((this->scrollbars[0].enabled != false) && (this->scrollbars[1].enabled == true)) {
    CreateCorner(this);
    Box::Box(&local_b8);
    fVar10 = local_e0.x;
    VVar3.y = local_e0.x;
    VVar3.x = local_e0.x;
    LayoutDetails::BuildBox(&local_b8,VVar3,this->corner,Block);
    _content.y = this->scrollbars[1].size;
    _content.x = this->scrollbars[0].size;
    Box::SetContent(&local_b8,_content);
    Element::SetBox(this->corner,&local_b8);
    pEVar2 = this->corner;
    VVar3 = Box::GetPosition(this_00,Padding);
    local_c8._8_4_ = extraout_XMM0_Dc_00;
    local_c8._0_4_ = VVar3.x;
    local_c8._4_4_ = VVar3.y;
    local_c8._12_4_ = extraout_XMM0_Dd_00;
    fVar11 = local_e0.y;
    fVar9 = this->scrollbars[0].size;
    local_d8._0_4_ = this->scrollbars[1].size;
    VVar3 = Box::GetPosition(&local_b8,Margin);
    offset_00.y = (((float)local_c8._4_4_ + fVar11) - (float)local_d8._0_4_) - VVar3.y;
    offset_00.x = ((fVar10 + (float)local_c8._0_4_) - fVar9) - VVar3.x;
    Element::SetOffset(pEVar2,offset_00,this->element,true);
    pEVar2 = this->corner;
    local_80.value.type = NONE;
    Variant::Set(&local_80.value,0);
    local_80.unit = KEYWORD;
    local_80.specificity = -1;
    local_80.definition = (PropertyDefinition *)0x0;
    local_80.parser_index = -1;
    local_80.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_80.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Element::SetProperty(pEVar2,Visibility,&local_80);
    if (local_80.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.source.
                 super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    Variant::~Variant(&local_80.value);
    Box::~Box(&local_b8);
  }
  return;
}

Assistant:

void ElementScroll::FormatScrollbars()
{
	const Box& element_box = element->GetBox();
	const Vector2f containing_block = element_box.GetSize(BoxArea::Padding);

	for (int i = 0; i < 2; i++)
	{
		if (!scrollbars[i].enabled)
			continue;

		if (i == VERTICAL)
		{
			scrollbars[i].widget->SetBarLength(element->GetClientHeight());
			scrollbars[i].widget->SetTrackLength(element->GetScrollHeight());

			float traversable_track = element->GetScrollHeight() - element->GetClientHeight();
			if (traversable_track > 0)
				scrollbars[i].widget->SetBarPosition(element->GetScrollTop() / traversable_track);
			else
				scrollbars[i].widget->SetBarPosition(0);
		}
		else
		{
			scrollbars[i].widget->SetBarLength(element->GetClientWidth());
			scrollbars[i].widget->SetTrackLength(element->GetScrollWidth());

			float traversable_track = element->GetScrollWidth() - element->GetClientWidth();
			if (traversable_track > 0)
				scrollbars[i].widget->SetBarPosition(element->GetScrollLeft() / traversable_track);
			else
				scrollbars[i].widget->SetBarPosition(0);
		}

		float slider_length = containing_block[1 - i];
		float user_scrollbar_margin = scrollbars[i].element->GetComputedValues().scrollbar_margin();
		float min_scrollbar_margin = GetScrollbarSize(i == VERTICAL ? HORIZONTAL : VERTICAL);
		slider_length -= Math::Max(user_scrollbar_margin, min_scrollbar_margin);

		scrollbars[i].widget->FormatElements(containing_block, slider_length);

		int variable_axis = i == VERTICAL ? 0 : 1;
		Vector2f offset = element_box.GetPosition(BoxArea::Padding);
		offset[variable_axis] += containing_block[variable_axis] -
			(scrollbars[i].element->GetBox().GetSize(BoxArea::Border)[variable_axis] +
				scrollbars[i].element->GetBox().GetEdge(BoxArea::Margin, i == VERTICAL ? BoxEdge::Right : BoxEdge::Bottom));
		// Add the top or left margin (as appropriate) onto the scrollbar's position.
		offset[1 - variable_axis] += scrollbars[i].element->GetBox().GetEdge(BoxArea::Margin, i == VERTICAL ? BoxEdge::Top : BoxEdge::Left);
		scrollbars[i].element->SetOffset(offset, element, true);
	}

	// Format the corner, if it is necessary.
	if (scrollbars[0].enabled && scrollbars[1].enabled)
	{
		CreateCorner();

		Box corner_box;
		LayoutDetails::BuildBox(corner_box, Vector2f(containing_block.x), corner);

		corner_box.SetContent(Vector2f(scrollbars[VERTICAL].size, scrollbars[HORIZONTAL].size));
		corner->SetBox(corner_box);
		corner->SetOffset(containing_block + element_box.GetPosition(BoxArea::Padding) -
				Vector2f(scrollbars[VERTICAL].size, scrollbars[HORIZONTAL].size) - corner_box.GetPosition(BoxArea::Margin),
			element, true);

		corner->SetProperty(PropertyId::Visibility, Property(Style::Visibility::Visible));
	}
}